

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

double nk_strtod(char *str,char **endptr)

{
  char *pcVar1;
  char *pcVar2;
  char cVar3;
  int iVar4;
  int iVar5;
  char *p;
  bool bVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  
  if (str == (char *)0x0) {
    return 0.0;
  }
  for (; *str == ' '; str = str + 1) {
  }
  if (*str == '-') {
    str = str + 1;
    dVar7 = -1.0;
  }
  else {
    dVar7 = 1.0;
  }
  dVar8 = 0.0;
  while( true ) {
    cVar3 = *str;
    if ((cVar3 == '\0') || (cVar3 == 'e')) goto LAB_001069e1;
    if (cVar3 == '.') break;
    dVar8 = dVar8 * 10.0 + (double)(cVar3 + -0x30);
    str = str + 1;
  }
  dVar9 = 0.1;
  while( true ) {
    str = str + 1;
    cVar3 = *str;
    if ((cVar3 == '\0') || (cVar3 == 'e')) break;
    dVar8 = dVar8 + (double)(cVar3 + -0x30) * dVar9;
    dVar9 = dVar9 * 0.1;
  }
LAB_001069e1:
  if (cVar3 == 'e') {
    pcVar1 = str + 1;
    pcVar2 = str + 1;
    str = str + 2;
    if ((*pcVar2 - 0x2bU & 0xfd) != 0) {
      str = pcVar1;
    }
    iVar4 = 0;
    for (; *str != '\0'; str = str + 1) {
      iVar4 = iVar4 * 10 + (int)*str + -0x30;
    }
    iVar5 = 0;
    if (0 < iVar4) {
      iVar5 = iVar4;
    }
    dVar9 = 1.0;
    while (bVar6 = iVar5 != 0, iVar5 = iVar5 + -1, bVar6) {
      dVar9 = dVar9 * 10.0;
    }
    if (*pcVar2 == '-') {
      dVar8 = dVar8 / dVar9;
    }
    else {
      dVar8 = dVar8 * dVar9;
    }
  }
  if (endptr == (char **)0x0) {
    return dVar7 * dVar8;
  }
  *endptr = str;
  return dVar7 * dVar8;
}

Assistant:

NK_API double
nk_strtod(const char *str, const char **endptr)
{
double m;
double neg = 1.0;
const char *p = str;
double value = 0;
double number = 0;

NK_ASSERT(str);
if (!str) return 0;

/* skip whitespace */
while (*p == ' ') p++;
if (*p == '-') {
neg = -1.0;
p++;
}

while (*p && *p != '.' && *p != 'e') {
value = value * 10.0 + (double) (*p - '0');
p++;
}

if (*p == '.') {
p++;
for(m = 0.1; *p && *p != 'e'; p++ ) {
value = value + (double) (*p - '0') * m;
m *= 0.1;
}
}
if (*p == 'e') {
int i, pow, div;
p++;
if (*p == '-') {
div = nk_true;
p++;
} else if (*p == '+') {
div = nk_false;
p++;
} else div = nk_false;

for (pow = 0; *p; p++)
pow = pow * 10 + (int) (*p - '0');

for (m = 1.0, i = 0; i < pow; i++)
m *= 10.0;

if (div)
value /= m;
else value *= m;
}
number = value * neg;
if (endptr)
*endptr = p;
return number;
}